

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

bool __thiscall httplib::Server::process_and_close_socket(Server *this,socket_t sock)

{
  bool bVar1;
  
  bVar1 = detail::
          process_server_socket<httplib::Server::process_and_close_socket(int)::_lambda(httplib::Stream&,bool,bool&)_1_>
                    (sock,this->keep_alive_max_count_,this->keep_alive_timeout_sec_,
                     this->read_timeout_sec_,this->read_timeout_usec_,this->write_timeout_sec_,
                     this->write_timeout_usec_,(anon_class_8_1_8991fb9c)this);
  detail::shutdown_socket(sock);
  close(sock);
  return bVar1;
}

Assistant:

inline bool Server::process_and_close_socket(socket_t sock) {
        auto ret = detail::process_server_socket(
            sock, keep_alive_max_count_, keep_alive_timeout_sec_, read_timeout_sec_,
            read_timeout_usec_, write_timeout_sec_, write_timeout_usec_,
            [this](Stream& strm, bool close_connection, bool& connection_closed) {
                return process_request(strm, close_connection, connection_closed,
                    nullptr);
            });

        detail::shutdown_socket(sock);
        detail::close_socket(sock);
        return ret;
    }